

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::load(BinaryBuffer *bb,Map *m)

{
  Direction *in_RDI;
  Direction k;
  size_t i;
  size_t s;
  Direction *in_stack_ffffffffffffff78;
  BinaryBuffer *in_stack_ffffffffffffff80;
  key_type *in_stack_ffffffffffffffb8;
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined8 local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    Direction::Direction((Direction *)0x1e6f6e);
    load<diy::Direction>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78 = in_RDI;
    in_stack_ffffffffffffff80 =
         (BinaryBuffer *)
         Catch::clara::std::
         map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    load<int>(in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78);
    Direction::~Direction((Direction *)0x1e6fbe);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Map& m)
    {
      size_t s;
      diy::load(bb, s);
      for (size_t i = 0; i < s; ++i)
      {
        K k;
        diy::load(bb, k);
        diy::load(bb, m[k]);
      }
    }